

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O0

LE_EulerAngles * __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::operator+=(LE_EulerAngles *this,LE_EulerAngles *Value)

{
  KFIXED<char,_(unsigned_char)__x03_> local_b8;
  KFIXED<char,_(unsigned_char)__x03_> local_a8;
  KFIXED<char,_(unsigned_char)__x03_> local_98;
  KFIXED<char,_(unsigned_char)__x03_> local_88;
  KFIXED<char,_(unsigned_char)__x03_> local_78;
  KFIXED<char,_(unsigned_char)__x03_> local_68 [2];
  KFIXED<char,_(unsigned_char)__x03_> local_48;
  KFIXED<char,_(unsigned_char)__x03_> local_38;
  KFIXED<char,_(unsigned_char)__x03_> local_28;
  LE_EulerAngles *local_18;
  LE_EulerAngles *Value_local;
  LE_EulerAngles *this_local;
  
  local_18 = Value;
  Value_local = this;
  KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_48,&Value->m_Psi);
  KFIXED<char,_(unsigned_char)'\x03'>::operator+(&local_38,&this->m_Psi);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_28,&this->m_Psi);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_28);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_38);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_48);
  KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_88,&local_18->m_Theta);
  KFIXED<char,_(unsigned_char)'\x03'>::operator+(&local_78,&this->m_Theta);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(local_68,&this->m_Theta);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(local_68);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_78);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_88);
  KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_b8,&local_18->m_Phi);
  KFIXED<char,_(unsigned_char)'\x03'>::operator+(&local_a8,&this->m_Phi);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_98,&this->m_Phi);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_98);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_a8);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_b8);
  return this;
}

Assistant:

LE_EulerAngles & LE_EulerAngles::operator += ( const LE_EulerAngles & Value )
{
    m_Psi   = m_Psi + Value.m_Psi;
    m_Theta = m_Theta + Value.m_Theta;
    m_Phi   = m_Phi + Value.m_Phi;
    return *this;
}